

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Node * __thiscall llvm::yaml::KeyValueNode::getKey(KeyValueNode *this)

{
  TokenKind TVar1;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  char *pcVar3;
  bool bVar4;
  Token *pTVar5;
  Node *__return_storage_ptr__;
  SMLoc local_40;
  char *local_30 [2];
  
  if (this->Key != (Node *)0x0) {
    return this->Key;
  }
  pTVar5 = Scanner::peekNext(*(Scanner **)
                              &((((this->super_Node).Doc)->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  TVar1 = pTVar5->Kind;
  bVar4 = true;
  __return_storage_ptr__ = (Node *)0x0;
  if ((int)TVar1 < 0x10) {
    if ((TVar1 != TK_Error) && (TVar1 != TK_BlockEnd)) goto LAB_00dc1edb;
  }
  else {
    if (TVar1 == TK_Key) {
      __return_storage_ptr__ = (Node *)&stack0xffffffffffffffa8;
      Scanner::getNext((Token *)__return_storage_ptr__,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((char **)local_40.Ptr != local_30) {
        operator_delete(local_40.Ptr,(ulong)(local_30[0] + 1));
      }
      goto LAB_00dc1edb;
    }
    if (TVar1 != TK_Value) goto LAB_00dc1edb;
  }
  __return_storage_ptr__ =
       (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                         super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                         .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                        _M_head_impl)->NodeAllocator,0x10);
  if (__return_storage_ptr__ == (Node *)0x0) {
    __return_storage_ptr__ = (Node *)0x0;
  }
  else {
    puVar2 = (this->super_Node).Doc;
    __return_storage_ptr__->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
    ((StringRef *)&__return_storage_ptr__->Doc)->Data = (char *)puVar2;
    (__return_storage_ptr__->SourceRange).Start.Ptr = (char *)0x0;
    (__return_storage_ptr__->SourceRange).End.Ptr = (char *)0x0;
    __return_storage_ptr__->TypeID = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&__return_storage_ptr__->Anchor)->_M_allocated_capacity = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->Anchor + 8) = 0;
    (__return_storage_ptr__->Tag).Data = (char *)0x0;
    (__return_storage_ptr__->Tag).Length = 0;
    pTVar5 = Scanner::peekNext(*(Scanner **)
                                &((puVar2->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    pcVar3 = (pTVar5->Range).Data;
    (__return_storage_ptr__->SourceRange).Start.Ptr = pcVar3;
    (__return_storage_ptr__->SourceRange).End.Ptr = pcVar3;
    __return_storage_ptr__->_vptr_Node = (_func_int **)&PTR_anchor_01099790;
  }
  this->Key = __return_storage_ptr__;
  bVar4 = false;
LAB_00dc1edb:
  if (bVar4) {
    pTVar5 = Scanner::peekNext(*(Scanner **)
                                &((((this->super_Node).Doc)->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    if ((pTVar5->Kind == TK_Value) || (pTVar5->Kind == TK_BlockEnd)) {
      __return_storage_ptr__ =
           (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                            _M_head_impl)->NodeAllocator,0x10);
      if (__return_storage_ptr__ == (Node *)0x0) {
        __return_storage_ptr__ = (Node *)0x0;
      }
      else {
        puVar2 = (this->super_Node).Doc;
        __return_storage_ptr__->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
        ((StringRef *)&__return_storage_ptr__->Doc)->Data = (char *)puVar2;
        (__return_storage_ptr__->SourceRange).Start.Ptr = (char *)0x0;
        (__return_storage_ptr__->SourceRange).End.Ptr = (char *)0x0;
        __return_storage_ptr__->TypeID = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&__return_storage_ptr__->Anchor)->_M_allocated_capacity = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->Anchor + 8) = 0;
        (__return_storage_ptr__->Tag).Data = (char *)0x0;
        (__return_storage_ptr__->Tag).Length = 0;
        pTVar5 = Scanner::peekNext(*(Scanner **)
                                    &((puVar2->_M_t).
                                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                     _M_head_impl)->stream->scanner);
        pcVar3 = (pTVar5->Range).Data;
        (__return_storage_ptr__->SourceRange).Start.Ptr = pcVar3;
        (__return_storage_ptr__->SourceRange).End.Ptr = pcVar3;
        __return_storage_ptr__->_vptr_Node = (_func_int **)&PTR_anchor_01099790;
      }
    }
    else {
      __return_storage_ptr__ =
           Document::parseBlockNode
                     ((((this->super_Node).Doc)->_M_t).
                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
    }
    this->Key = __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

Node *KeyValueNode::getKey() {
  if (Key)
    return Key;
  // Handle implicit null keys.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_Value
        || t.Kind == Token::TK_Error) {
      return Key = new (getAllocator()) NullNode(Doc);
    }
    if (t.Kind == Token::TK_Key)
      getNext(); // skip TK_Key.
  }

  // Handle explicit null keys.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Value) {
    return Key = new (getAllocator()) NullNode(Doc);
  }

  // We've got a normal key.
  return Key = parseBlockNode();
}